

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.c
# Opt level: O3

void format_time(unsigned_long time,char *str,uint len)

{
  snprintf(str,(ulong)len,"%.2lu:%.2lu:%.2lu+%.3lu",time / 3600000,(time / 60000) % 0x3c,
           (time / 1000) % 0x3c,time % 1000);
  return;
}

Assistant:

void format_time(unsigned long time, char *str, unsigned int len) {
    unsigned long ms = time % 1000;
    time /= 1000;
    unsigned long secs = time % 60;
    time /= 60;
    unsigned long minutes = time % 60;
    time /= 60;
    unsigned long hours = time;

    snprintf(str, len, "%.2lu:%.2lu:%.2lu+%.3lu", hours, minutes, secs, ms);
}